

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

PropertySymOpnd * __thiscall
IR::PropertySymOpnd::CopyWithoutFlowSensitiveInfo(PropertySymOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  nullptr_t in_RAX;
  PropertySymOpnd *this_00;
  undefined4 *puVar3;
  nullptr_t local_28;
  
  local_28 = in_RAX;
  this_00 = CopyCommon(this,func);
  SetObjTypeSpecFldInfo(this_00,this->objTypeSpecFldInfo);
  *(byte *)&this_00->field_12 = *(byte *)&this_00->field_12 & 0xfd | *(byte *)&this->field_12 & 2;
  if ((this_00->field_12).field_0.field_5.typeCheckSeqFlags != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x38e,"(newOpnd->typeCheckSeqFlags == 0)","newOpnd->typeCheckSeqFlags == 0")
    ;
    if (!bVar2) goto LAB_006165e8;
    *puVar3 = 0;
  }
  local_28 = (nullptr_t)0x0;
  bVar2 = JITTypeHolderBase<void>::operator==(&this_00->finalType,&local_28);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x38f,"(newOpnd->finalType == nullptr)","newOpnd->finalType == nullptr");
    if (!bVar2) goto LAB_006165e8;
    *puVar3 = 0;
  }
  if (this_00->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x390,"(newOpnd->guardedPropOps == nullptr)",
                       "newOpnd->guardedPropOps == nullptr");
    if (!bVar2) goto LAB_006165e8;
    *puVar3 = 0;
  }
  if (this_00->writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x391,"(newOpnd->writeGuards == nullptr)","newOpnd->writeGuards == nullptr")
    ;
    if (!bVar2) {
LAB_006165e8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Opnd::SetIsJITOptimizedReg
            ((Opnd *)this_00,(bool)(((this->super_SymOpnd).super_Opnd.field_0xb & 8) >> 3));
  return this_00;
}

Assistant:

PropertySymOpnd *
PropertySymOpnd::CopyWithoutFlowSensitiveInfo(Func *func)
{
    PropertySymOpnd *newOpnd = CopyCommon(func);
    newOpnd->SetObjTypeSpecFldInfo(this->objTypeSpecFldInfo);

    // This field is not flow sensitive.  It is only on if the instruction is CheckFixedMethodFld.  If we ever
    // hoist CheckFixedMethodFld (or otherwise copy it), we must make sure not to change the opcode.
    newOpnd->usesFixedValue = this->usesFixedValue;

    // Note that the following fields are flow sensitive. If we're cloning this operand in order to attach it to
    // an instruction elsewhere in the flow (e.g. field hoisting or copy propagation), these fields cannot be copied.
    // If the caller knows some of them can be safely copied, the caller must do so manually.
    Assert(newOpnd->typeCheckSeqFlags == 0);
    Assert(newOpnd->finalType == nullptr);
    Assert(newOpnd->guardedPropOps == nullptr);
    Assert(newOpnd->writeGuards == nullptr);

    newOpnd->SetIsJITOptimizedReg(this->GetIsJITOptimizedReg());

    return newOpnd;
}